

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
array<CLayerGroup_*,_allocator_default<CLayerGroup_*>_>::clear
          (array<CLayerGroup_*,_allocator_default<CLayerGroup_*>_> *this)

{
  CLayerGroup *pCVar1;
  CLayerGroup **in_RDI;
  
  allocator_default<CLayerGroup_*>::free_array(in_RDI);
  *(undefined4 *)(in_RDI + 1) = 1;
  pCVar1 = (CLayerGroup *)allocator_default<CLayerGroup_*>::alloc_array(0);
  *in_RDI = pCVar1;
  *(undefined4 *)((long)in_RDI + 0xc) = 0;
  return;
}

Assistant:

void clear()
	{
		ALLOCATOR::free_array(list);
		list_size = 1;
		list = ALLOCATOR::alloc_array(list_size);
		num_elements = 0;
	}